

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O2

bool Diligent::LinuxFileSystem::PathExists(Char *strPath)

{
  int iVar1;
  string path;
  stat StatBuff;
  String local_c0;
  stat local_a0;
  
  std::__cxx11::string::string((string *)&local_c0,strPath,(allocator *)&local_a0);
  BasicFileSystem::CorrectSlashes(&local_c0,'\0');
  iVar1 = stat(local_c0._M_dataplus._M_p,&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return iVar1 == 0;
}

Assistant:

bool LinuxFileSystem::PathExists(const Char* strPath)
{
    std::string path{strPath};
    CorrectSlashes(path);

    struct stat StatBuff;
    return (stat(path.c_str(), &StatBuff) == 0);
}